

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitmapDevice.cpp
# Opt level: O2

void __thiscall
TRM::BitmapDevice::Triangle
          (BitmapDevice *this,Vec3f *a,Vec3f *b,Vec3f *c,Color *ca,Color *cb,Color *cc)

{
  Matrix *m;
  uint uVar1;
  element_type *peVar2;
  pointer pfVar3;
  char cVar4;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  undefined1 auVar12 [16];
  undefined6 uVar13;
  undefined8 uVar14;
  unkbyte10 Var15;
  undefined1 auVar16 [12];
  undefined1 auVar17 [14];
  short sVar18;
  float fVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  undefined1 auVar23 [13];
  undefined1 auVar24 [13];
  vec<3,_float,_(glm::qualifier)0> A;
  vec<3,_float,_(glm::qualifier)0> B;
  vec<3,_float,_(glm::qualifier)0> C;
  undefined8 uVar25;
  BitmapDevice *pBVar26;
  int *piVar27;
  float *pfVar28;
  long lVar29;
  ulong uVar30;
  int j;
  int iVar31;
  undefined1 uVar32;
  undefined1 uVar33;
  undefined1 uVar34;
  undefined1 uVar35;
  char cVar36;
  undefined1 extraout_XMM0_Bi;
  undefined1 extraout_XMM0_Bj;
  undefined1 extraout_XMM0_Bk;
  char cVar37;
  undefined1 extraout_XMM0_Bl;
  undefined1 extraout_XMM0_Bm;
  undefined1 extraout_XMM0_Bn;
  undefined1 extraout_XMM0_Bo;
  char cVar38;
  undefined1 extraout_XMM0_Bp;
  float fVar39;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aVar40;
  undefined4 uVar41;
  undefined4 uVar42;
  undefined4 uVar43;
  float fVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  float fVar47;
  float fVar48;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 in_XMM7_Da;
  col_type cVar49;
  Vec3f VVar50;
  vec<3,_float,_(glm::qualifier)0> P;
  array<glm::vec<3,_float,_(glm::qualifier)0>,_3UL> pts;
  Vec2i bboxmax;
  Vec2i bboxmin;
  Color c_1;
  Vec2i clamp;
  undefined8 local_118;
  vec<3,_float,_(glm::qualifier)0> local_f0;
  undefined8 local_e4;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_dc;
  undefined8 local_d8;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_d0;
  undefined8 local_c8;
  anon_union_4_3_4e90da17_for_vec<2,_int,_(glm::qualifier)0>_3 local_c0;
  int local_bc;
  undefined8 local_b8;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_b0;
  undefined4 local_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 local_98;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aStack_94;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aStack_90;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aStack_8c;
  undefined1 local_88 [16];
  undefined8 local_78;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  BitmapDevice *local_60;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  anon_union_4_3_4e90da17_for_vec<2,_int,_(glm::qualifier)0>_3 local_38;
  int local_34;
  char cVar5;
  char cVar6;
  char cVar7;
  
  peVar2 = (this->mBitmap).super___shared_ptr<TRM::Bitmap,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar1 = peVar2->fWidth;
  local_78 = (ulong)uVar1;
  local_c0.x = uVar1 - 1;
  local_bc = peVar2->fHeight - 1;
  local_c8._0_4_ = (anon_union_4_3_4e90da17_for_vec<2,_int,_(glm::qualifier)0>_3)0x0;
  local_c8._4_4_ = (anon_union_4_3_4e90b0ec_for_vec<2,_int,_(glm::qualifier)0>_5)0x0;
  local_88._0_4_ = *(undefined4 *)(ca->fRGBA)._M_elems;
  local_98 = *(anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 *)(cb->fRGBA)._M_elems
  ;
  local_a8 = *(float *)(cc->fRGBA)._M_elems;
  m = &this->mMatrix;
  local_b0 = a->field_2;
  local_b8._0_4_ = *(anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 *)&a->field_0;
  local_b8._4_4_ = *(anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 *)&a->field_1;
  local_ac = 1.0;
  local_60 = this;
  local_38.x = local_c0.x;
  local_34 = local_bc;
  cVar49 = glm::operator*(m,(row_type *)&local_b8);
  local_f0._0_8_ = cVar49._0_8_;
  local_f0.field_2 = (anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7)cVar49.field_2;
  local_b0 = b->field_2;
  local_b8._0_4_ = *(anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 *)&b->field_0;
  local_b8._4_4_ = *(anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 *)&b->field_1;
  local_ac = 1.0;
  cVar49 = glm::operator*(m,(row_type *)&local_b8);
  local_e4 = cVar49._0_8_;
  local_dc = (anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7)cVar49.field_2;
  local_b0 = c->field_2;
  local_b8._0_4_ = *(anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 *)&c->field_0;
  local_b8._4_4_ = *(anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 *)&c->field_1;
  local_ac = 1.0;
  cVar49 = glm::operator*(m,(row_type *)&local_b8);
  local_d8 = cVar49._0_8_;
  local_d0 = (anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7)cVar49.field_2;
  for (lVar29 = 0; pBVar26 = local_60, lVar29 != 3; lVar29 = lVar29 + 1) {
    for (iVar31 = 0; iVar31 != 2; iVar31 = iVar31 + 1) {
      piVar27 = glm::vec<2,_int,_(glm::qualifier)0>::operator[]
                          ((vec<2,_int,_(glm::qualifier)0> *)&local_c0,iVar31);
      fVar39 = (float)*piVar27;
      pfVar28 = glm::vec<3,_float,_(glm::qualifier)0>::operator[](&local_f0 + lVar29,iVar31);
      fVar48 = *pfVar28;
      uVar32 = SUB41(fVar48,0);
      uVar33 = (undefined1)((uint)fVar48 >> 8);
      uVar34 = (undefined1)((uint)fVar48 >> 0x10);
      uVar35 = (undefined1)((uint)fVar48 >> 0x18);
      if (fVar39 <= fVar48) {
        uVar32 = SUB41(fVar39,0);
        uVar33 = (undefined1)((uint)fVar39 >> 8);
        uVar34 = (undefined1)((uint)fVar39 >> 0x10);
        uVar35 = (undefined1)((uint)fVar39 >> 0x18);
      }
      if ((float)CONCAT13(uVar35,CONCAT12(uVar34,CONCAT11(uVar33,uVar32))) <= 0.0) {
        uVar32 = 0;
        uVar33 = 0;
        uVar34 = 0;
        uVar35 = 0;
      }
      piVar27 = glm::vec<2,_int,_(glm::qualifier)0>::operator[]
                          ((vec<2,_int,_(glm::qualifier)0> *)&local_c0,iVar31);
      *piVar27 = (int)(float)CONCAT13(uVar35,CONCAT12(uVar34,CONCAT11(uVar33,uVar32)));
      piVar27 = glm::vec<2,_int,_(glm::qualifier)0>::operator[]
                          ((vec<2,_int,_(glm::qualifier)0> *)&local_38,iVar31);
      fVar39 = (float)*piVar27;
      piVar27 = glm::vec<2,_int,_(glm::qualifier)0>::operator[]
                          ((vec<2,_int,_(glm::qualifier)0> *)&local_c8,iVar31);
      fVar47 = (float)*piVar27;
      pfVar28 = glm::vec<3,_float,_(glm::qualifier)0>::operator[](&local_f0 + lVar29,iVar31);
      fVar48 = *pfVar28;
      uVar32 = SUB41(fVar48,0);
      uVar33 = (undefined1)((uint)fVar48 >> 8);
      uVar34 = (undefined1)((uint)fVar48 >> 0x10);
      uVar35 = (undefined1)((uint)fVar48 >> 0x18);
      if (fVar48 <= fVar47) {
        uVar32 = SUB41(fVar47,0);
        uVar33 = (undefined1)((uint)fVar47 >> 8);
        uVar34 = (undefined1)((uint)fVar47 >> 0x10);
        uVar35 = (undefined1)((uint)fVar47 >> 0x18);
      }
      if (fVar39 <= (float)CONCAT13(uVar35,CONCAT12(uVar34,CONCAT11(uVar33,uVar32)))) {
        uVar32 = SUB41(fVar39,0);
        uVar33 = (undefined1)((uint)fVar39 >> 8);
        uVar34 = (undefined1)((uint)fVar39 >> 0x10);
        uVar35 = (undefined1)((uint)fVar39 >> 0x18);
      }
      piVar27 = glm::vec<2,_int,_(glm::qualifier)0>::operator[]
                          ((vec<2,_int,_(glm::qualifier)0> *)&local_c8,iVar31);
      *piVar27 = (int)(float)CONCAT13(uVar35,CONCAT12(uVar34,CONCAT11(uVar33,uVar32)));
    }
  }
  fVar48 = (float)local_c0.x;
  uVar32 = SUB41(fVar48,0);
  uVar33 = (undefined1)((uint)fVar48 >> 8);
  uVar34 = (undefined1)((uint)fVar48 >> 0x10);
  fVar39 = (float)(int)(float)local_78;
  auVar45._12_4_ = (uint)local_88._0_4_ >> 0x18;
  auVar45._8_4_ = (uint)local_88._0_4_ >> 0x10;
  auVar45._4_4_ = (uint)local_88._0_4_ >> 8;
  auVar45._0_4_ = local_88._0_4_;
  auVar45 = auVar45 & _DAT_0011a740;
  fStack_a4 = (float)auVar45._4_4_;
  fStack_a0 = (float)auVar45._8_4_;
  fStack_9c = (float)auVar45._12_4_;
  auVar24[0xc] = local_98._3_1_;
  auVar24._0_12_ = ZEXT712(0);
  local_48 = (float)((uint)local_98 & 0xff);
  fStack_44 = (float)((uint)local_98 >> 8 & 0xff);
  fStack_40 = (float)(int)CONCAT32(auVar24._10_3_,(ushort)local_98._2_1_);
  fStack_3c = (float)(uint3)(auVar24._10_3_ >> 0x10);
  auVar23[0xc] = (char)((uint)local_a8 >> 0x18);
  auVar23._0_12_ = ZEXT712(0);
  local_58 = (float)((uint)local_a8 & 0xff);
  fStack_54 = (float)((uint)local_a8 >> 8 & 0xff);
  fStack_50 = (float)(int)CONCAT32(auVar23._10_3_,(ushort)(byte)((uint)local_a8 >> 0x10));
  fStack_4c = (float)(uint3)(auVar23._10_3_ >> 0x10);
  uVar35 = (undefined1)((uint)fVar48 >> 0x18);
  local_a8 = (float)auVar45._0_4_;
  while ((float)CONCAT13(uVar35,CONCAT12(uVar34,CONCAT11(uVar33,uVar32))) <= (float)local_c8._0_4_)
  {
    fVar48 = (float)CONCAT13(uVar35,CONCAT12(uVar34,CONCAT11(uVar33,uVar32)));
    for (fVar47 = (float)local_bc; fVar47 <= (float)local_c8._4_4_; fVar47 = fVar47 + 1.0) {
      A.field_2.z = local_f0.field_2.z;
      A.field_0 = local_f0.field_0;
      A.field_1 = local_f0.field_1;
      B.field_2.z = local_dc.z;
      B.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)
                  (undefined4)local_e4;
      B.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)local_e4._4_4_;
      C.field_2.z = local_d0.z;
      C.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)
                  (undefined4)local_d8;
      C.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)local_d8._4_4_;
      uVar41 = 0;
      uVar42 = 0;
      uVar43 = 0;
      P.field_2.z = in_XMM7_Da.y;
      P.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)fVar48;
      P.field_1.y = fVar47;
      VVar50 = barycentric<3ul>(A,B,C,P);
      aVar40 = VVar50.field_2;
      auVar46._0_8_ = VVar50._0_8_;
      auVar46[9] = extraout_XMM0_Bj;
      auVar46[8] = extraout_XMM0_Bi;
      auVar46[10] = extraout_XMM0_Bk;
      auVar46[0xb] = extraout_XMM0_Bl;
      auVar46[0xd] = extraout_XMM0_Bn;
      auVar46[0xc] = extraout_XMM0_Bm;
      auVar46[0xe] = extraout_XMM0_Bo;
      auVar46[0xf] = extraout_XMM0_Bp;
      if (((0.0 <= VVar50.field_0.x) && (in_XMM7_Da = VVar50.field_1, 0.0 <= in_XMM7_Da.y)) &&
         (0.0 <= aVar40.z)) {
        fVar44 = fVar47 * fVar39 + fVar48;
        uVar30 = (ulong)fVar44;
        fVar19 = local_d0.z * aVar40.z +
                 local_f0.field_2.z * VVar50.field_0.x + local_dc.z * in_XMM7_Da.y;
        uVar30 = (long)(fVar44 - 9.223372e+18) & (long)uVar30 >> 0x3f | uVar30;
        pfVar3 = (pBVar26->mZBuffer).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pfVar28 = pfVar3 + uVar30;
        if (fVar19 < *pfVar28 || fVar19 == *pfVar28) {
          pfVar3[uVar30] = fVar19;
          local_78 = CONCAT44(uVar41,aVar40);
          local_98 = in_XMM7_Da;
          aStack_94 = in_XMM7_Da;
          aStack_90 = in_XMM7_Da;
          aStack_8c = in_XMM7_Da;
          local_88 = auVar46;
          uStack_70 = uVar42;
          uStack_6c = uVar43;
          Color::Color((Color *)&local_b8);
          uVar25 = local_b8;
          iVar31 = (int)((float)local_78 * local_58 +
                        (float)local_88._0_4_ * local_a8 + local_98.y * local_48);
          iVar20 = (int)((float)local_78 * fStack_54 +
                        (float)local_88._0_4_ * fStack_a4 + aStack_94.y * fStack_44);
          cVar36 = (char)((uint)iVar20 >> 0x10);
          iVar21 = (int)((float)local_78 * fStack_50 +
                        (float)local_88._0_4_ * fStack_a0 + aStack_90.y * fStack_40);
          cVar37 = (char)((uint)iVar21 >> 0x10);
          iVar22 = (int)((float)local_78 * fStack_4c +
                        (float)local_88._0_4_ * fStack_9c + aStack_8c.y * fStack_3c);
          cVar38 = (char)((uint)iVar22 >> 0x10);
          uVar13 = CONCAT15((char)((uint)iVar20 >> 8),CONCAT14((char)iVar20,iVar31));
          uVar14 = CONCAT17((char)((uint)iVar20 >> 0x18),CONCAT16(cVar36,uVar13));
          Var15 = CONCAT19((char)((uint)iVar21 >> 8),CONCAT18((char)iVar21,uVar14));
          auVar16[10] = cVar37;
          auVar16._0_10_ = Var15;
          auVar16[0xb] = (char)((uint)iVar21 >> 0x18);
          auVar17[0xc] = (char)iVar22;
          auVar17._0_12_ = auVar16;
          auVar17[0xd] = (char)((uint)iVar22 >> 8);
          auVar12[0xe] = cVar38;
          auVar12._0_14_ = auVar17;
          auVar12[0xf] = (char)((uint)iVar22 >> 0x18);
          sVar8 = (short)iVar31;
          cVar4 = (0 < sVar8) * (sVar8 < 0x100) * (char)iVar31 - (0xff < sVar8);
          sVar8 = (short)((uint)iVar31 >> 0x10);
          sVar9 = (short)((uint6)uVar13 >> 0x20);
          cVar5 = (0 < sVar9) * (sVar9 < 0x100) * (char)iVar20 - (0xff < sVar9);
          sVar9 = (short)((ulong)uVar14 >> 0x30);
          sVar10 = (short)((unkuint10)Var15 >> 0x40);
          cVar6 = (0 < sVar10) * (sVar10 < 0x100) * (char)iVar21 - (0xff < sVar10);
          sVar10 = auVar16._10_2_;
          sVar11 = auVar17._12_2_;
          cVar7 = (0 < sVar11) * (sVar11 < 0x100) * (char)iVar22 - (0xff < sVar11);
          sVar11 = auVar12._14_2_;
          sVar18 = CONCAT11((0 < sVar8) * (sVar8 < 0x100) * (char)((uint)iVar31 >> 0x10) -
                            (0xff < sVar8),cVar4);
          uVar41 = CONCAT13((0 < sVar9) * (sVar9 < 0x100) * cVar36 - (0xff < sVar9),
                            CONCAT12(cVar5,sVar18));
          uVar13 = CONCAT15((0 < sVar10) * (sVar10 < 0x100) * cVar37 - (0xff < sVar10),
                            CONCAT14(cVar6,uVar41));
          sVar8 = (short)((uint)uVar41 >> 0x10);
          sVar9 = (short)((uint6)uVar13 >> 0x20);
          sVar10 = (short)(CONCAT17((0 < sVar11) * (sVar11 < 0x100) * cVar38 - (0xff < sVar11),
                                    CONCAT16(cVar7,uVar13)) >> 0x30);
          local_b8._1_1_ = (0 < sVar8) * (sVar8 < 0x100) * cVar5 - (0xff < sVar8);
          local_b8._0_1_ = (0 < sVar18) * (sVar18 < 0x100) * cVar4 - (0xff < sVar18);
          local_b8._2_1_ = (0 < sVar9) * (sVar9 < 0x100) * cVar6 - (0xff < sVar9);
          local_b8._3_1_ = (0 < sVar10) * (sVar10 < 0x100) * cVar7 - (0xff < sVar10);
          local_b8._4_4_ = SUB84(uVar25,4);
          Bitmap::SetPixel((pBVar26->mBitmap).
                           super___shared_ptr<TRM::Bitmap,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                           (uint32_t)(long)fVar48,(uint32_t)(long)fVar47,(Color *)&local_b8);
        }
      }
    }
    fVar48 = fVar48 + 1.0;
    uVar32 = SUB41(fVar48,0);
    uVar33 = (undefined1)((uint)fVar48 >> 8);
    uVar34 = (undefined1)((uint)fVar48 >> 0x10);
    uVar35 = (undefined1)((uint)fVar48 >> 0x18);
  }
  return;
}

Assistant:

void BitmapDevice::Triangle(Vec3f const& a, Vec3f const& b, Vec3f const& c,
                            Color const& ca, Color const& cb, Color const& cc) {
  int32_t bitmap_width = mBitmap->width();
  int32_t bitmap_height = mBitmap->height();

  Vec2i bboxmin(bitmap_width - 1, bitmap_height - 1);
  Vec2i bboxmax(0, 0);
  Vec2i clamp(bitmap_width - 1, bitmap_height - 1);

  std::array<Vec3f, 3> pts;
  std::array<Color, 3> colors{ca, cb, cc};

  pts[0] = mMatrix * Vec4f{a.x, a.y, a.z, 1.f};
  pts[1] = mMatrix * Vec4f{b.x, b.y, b.z, 1.f};
  pts[2] = mMatrix * Vec4f{c.x, c.y, c.z, 1.f};

  for (int i = 0; i < 3; i++) {
    for (int j = 0; j < 2; j++) {
      bboxmin[j] = (int)std::max(
          0.f, std::min(static_cast<float>(bboxmin[j]), pts[i][j]));
      bboxmax[j] =
          (int)std::min(static_cast<float>(clamp[j]),
                        std::max(static_cast<float>(bboxmax[j]), pts[i][j]));
    }
  }

  Vec3f p;
  for (p[0] = bboxmin.x; p[0] <= bboxmax.x; p[0]++) {
    for (p[1] = bboxmin.y; p[1] <= bboxmax.y; p[1]++) {
      Vec3f bc_screen = barycentric<3>(pts[0], pts[1], pts[2], p);
      if (bc_screen[0] < 0 || bc_screen[1] < 0 || bc_screen[2] < 0) continue;

      float pz = pts[0][2] * bc_screen[0] + pts[1][2] * bc_screen[1] +
                 pts[2][2] * bc_screen[2];

      size_t zIndex = static_cast<size_t>(p.x + p.y * bitmap_width);
      if (mZBuffer[zIndex] < pz) continue;

      mZBuffer[zIndex] = pz;

      Color c;
      /*
          barycentric result can also interpolation Color
      */

      c.rgba()[0] = bc_screen[0] * colors[0].rgba()[0] +
                    bc_screen[1] * colors[1].rgba()[0] +
                    bc_screen[2] * colors[2].rgba()[0];
      c.rgba()[1] = bc_screen[0] * colors[0].rgba()[1] +
                    bc_screen[1] * colors[1].rgba()[1] +
                    bc_screen[2] * colors[2].rgba()[1];
      c.rgba()[2] = bc_screen[0] * colors[0].rgba()[2] +
                    bc_screen[1] * colors[1].rgba()[2] +
                    bc_screen[2] * colors[2].rgba()[2];
      c.rgba()[3] = bc_screen[0] * colors[0].rgba()[3] +
                    bc_screen[1] * colors[1].rgba()[3] +
                    bc_screen[2] * colors[2].rgba()[3];

      mBitmap->SetPixel(static_cast<uint32_t>(p.x), static_cast<uint32_t>(p.y),
                        c);
    }
  }
}